

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

Unr_Man_t * Unr_ManAlloc(Gia_Man_t *pGia)

{
  int nCap;
  Unr_Man_t *pUVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *p;
  char *pcVar3;
  
  pUVar1 = (Unr_Man_t *)calloc(1,0x68);
  pUVar1->pGia = pGia;
  nCap = pGia->nObjs;
  pUVar1->nObjs = nCap;
  pVVar2 = Vec_IntAlloc(nCap);
  pUVar1->vOrder = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pUVar1->vOrderLim = pVVar2;
  pVVar2 = Vec_IntStartFull(nCap);
  pUVar1->vTents = pVVar2;
  pVVar2 = Vec_IntStart(nCap);
  pUVar1->vRanks = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  pUVar1->vObjLim = pVVar2;
  pVVar2 = Vec_IntAlloc(pGia->vCis->nSize);
  pUVar1->vCiMap = pVVar2;
  pVVar2 = Vec_IntAlloc(pGia->vCos->nSize);
  pUVar1->vCoMap = pVVar2;
  pVVar2 = Vec_IntAlloc(10000);
  pUVar1->vPiLits = pVVar2;
  p = Gia_ManStart(10000);
  pUVar1->pFrames = p;
  pcVar3 = Abc_UtilStrsav(pGia->pName);
  p->pName = pcVar3;
  Gia_ManHashStart(p);
  return pUVar1;
}

Assistant:

Unr_Man_t * Unr_ManAlloc( Gia_Man_t * pGia )
{
    Unr_Man_t * p;
    p = ABC_CALLOC( Unr_Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum(pGia);
    p->vOrder    = Vec_IntAlloc( p->nObjs );
    p->vOrderLim = Vec_IntAlloc( 100 );
    p->vTents    = Vec_IntStartFull( p->nObjs );
    p->vRanks    = Vec_IntStart( p->nObjs );
    p->vObjLim   = Vec_IntAlloc( 100 );
    p->vCiMap    = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCoMap    = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->vPiLits   = Vec_IntAlloc( 10000 );
    p->pFrames   = Gia_ManStart( 10000 );
    p->pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( p->pFrames );
    return p;
}